

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_*,_Memory::Recycler,_RealCount>::
EditingIterator::Next(EditingIterator *this)

{
  SListBase<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_*,_Memory::Recycler,_RealCount>
  *this_00;
  code *pcVar1;
  SListNodeBase<Memory::Recycler> **ppSVar2;
  undefined4 *puVar3;
  bool bVar4;
  SListNodeBase<Memory::Recycler> local_38;
  EditingIterator *local_30;
  EditingIterator *this_local;
  SListNodeBase<Memory::Recycler> local_20;
  EditingIterator *local_18;
  bool local_9;
  
  bVar4 = false;
  local_30 = this;
  if (this->last != (NodeBase *)0x0) {
    SListNodeBase<Memory::Recycler>::Next(&local_38);
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                        ((WriteBarrierPtr *)&local_38);
    bVar4 = *ppSVar2 != (this->super_Iterator).current;
  }
  if (bVar4) {
    (this->super_Iterator).current = this->last;
  }
  else {
    this->last = (this->super_Iterator).current;
  }
  local_18 = this;
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = (this->super_Iterator).list;
  SListNodeBase<Memory::Recycler>::Next(&local_20);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__((WriteBarrierPtr *)&local_20);
  local_9 = SListBase<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_*,_Memory::Recycler,_RealCount>
            ::IsHead(this_00,*ppSVar2);
  if (local_9) {
    (this->super_Iterator).current = (NodeBase *)0x0;
  }
  else {
    SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&this_local);
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                        ((WriteBarrierPtr *)&this_local);
    (this->super_Iterator).current = *ppSVar2;
  }
  local_9 = !local_9;
  return local_9;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }